

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_sini(CVmImageLoader *this,ulong siz)

{
  int iVar1;
  CVmStaticInitPage *pCVar2;
  CVmStaticInitPage *pCVar3;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char hdr [12];
  
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,hdr,0xc);
  uVar6 = (ulong)(uint)hdr._0_4_;
  this->static_cs_ofs_ = (ulong)(uint)hdr._4_4_;
  uVar5 = (ulong)(uint)hdr._8_4_;
  if (0xc < uVar6) {
    (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,uVar6 - 0xc);
  }
  lVar4 = siz - uVar6;
  for (; uVar5 != 0; uVar5 = uVar5 - uVar6) {
    uVar6 = 1000;
    if (uVar5 < 1000) {
      uVar6 = uVar5;
    }
    pCVar2 = (CVmStaticInitPage *)operator_new(0x18);
    pCVar2->cnt_ = uVar6;
    pCVar2->data_ = (char *)0x0;
    pCVar2->nxt_ = (CVmStaticInitPage *)0x0;
    pCVar3 = this->static_tail_;
    if (this->static_tail_ == (CVmStaticInitPage *)0x0) {
      pCVar3 = (CVmStaticInitPage *)&this->static_head_;
    }
    pCVar3->nxt_ = pCVar2;
    this->static_tail_ = pCVar2;
    iVar1 = (*this->fp_->_vptr_CVmImageFile[4])(this->fp_,uVar6 * 6,0,lVar4);
    pCVar2->data_ = (char *)CONCAT44(extraout_var,iVar1);
    lVar4 = lVar4 + uVar6 * -6;
  }
  if (lVar4 != 0) {
    (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,lVar4);
  }
  return;
}

Assistant:

void CVmImageLoader::load_sini(VMG_ ulong siz)
{
    char hdr[12];
    ulong siz_rem;
    ulong hdr_siz;
    ulong init_cnt;
    ulong init_rem;
    
    /* 
     *   read the header size, static code starting offset, and
     *   initializer count 
     */
    fp_->copy_data(hdr, 12);
    hdr_siz = t3rp4u(hdr);
    static_cs_ofs_ = t3rp4u(hdr + 4);
    init_cnt = t3rp4u(hdr + 8);

    /* skip any extra header information */
    if (hdr_siz > 12)
        fp_->skip_ahead(hdr_siz - 12);

    /* account for having read the header in our size remaining */
    siz_rem = siz - hdr_siz;

    /* read in chunks of VM_STATIC_INIT_PAGE_MAX initializers */
    for (init_rem = init_cnt ; init_rem != 0 ; )
    {
        size_t cur;
        CVmStaticInitPage *pg;

        /* read the page max, or the actual number remaining if fewer */
        cur = VM_STATIC_INIT_PAGE_MAX;
        if (init_rem < cur)
            cur = (size_t)init_rem;

        /* allocate the next page */
        pg = new CVmStaticInitPage(cur);

        /* link in the page */
        if (static_tail_ != 0)
            static_tail_->nxt_ = pg;
        else
            static_head_ = pg;
        static_tail_ = pg;

        /* read the page */
        pg->data_ = fp_->alloc_and_read(cur * 6, 0, siz_rem);

        /* adjust our counters for the chunk */
        init_rem -= cur;
        siz_rem -= cur * 6;
    }

    /* skip any data we don't use in this version */
    if (siz_rem != 0)
        fp_->skip_ahead(siz_rem);
}